

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecMem.h
# Opt level: O0

int Vec_MemHashInsert(Vec_Mem_t *p,word *pEntry)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *pSpot;
  word *pEntry_local;
  Vec_Mem_t *p_local;
  
  iVar2 = p->nEntries;
  iVar1 = Vec_IntSize(p->vTable);
  if (iVar1 < iVar2) {
    Vec_MemHashResize(p);
  }
  piVar3 = Vec_MemHashLookup(p,pEntry);
  if (*piVar3 == -1) {
    iVar2 = Vec_IntSize(p->vNexts);
    *piVar3 = iVar2;
    Vec_IntPush(p->vNexts,-1);
    Vec_MemPush(p,pEntry);
    iVar2 = p->nEntries;
    iVar1 = Vec_IntSize(p->vNexts);
    if (iVar2 != iVar1) {
      __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecMem.h"
                    ,0x172,"int Vec_MemHashInsert(Vec_Mem_t *, word *)");
    }
    iVar2 = Vec_IntSize(p->vNexts);
    p_local._4_4_ = iVar2 + -1;
  }
  else {
    p_local._4_4_ = *piVar3;
  }
  return p_local._4_4_;
}

Assistant:

static int Vec_MemHashInsert( Vec_Mem_t * p, word * pEntry )
{
    int * pSpot;
    if ( p->nEntries > Vec_IntSize(p->vTable) )
        Vec_MemHashResize( p );
    pSpot = Vec_MemHashLookup( p, pEntry );
    if ( *pSpot != -1 )
        return *pSpot;
    *pSpot = Vec_IntSize(p->vNexts);
    Vec_IntPush( p->vNexts, -1 );
    Vec_MemPush( p, pEntry );
    assert( p->nEntries == Vec_IntSize(p->vNexts) );
    return Vec_IntSize(p->vNexts) - 1;
}